

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

int leveldb::FindFile(InternalKeyComparator *icmp,
                     vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     *files,Slice *key)

{
  FileMetaData *pFVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (ulong)((long)(files->
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(files->
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar4 = (uint)uVar5;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      uVar7 = (int)uVar5 + uVar6 >> 1;
      pFVar1 = (files->
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar7];
      sVar2 = (pFVar1->largest).rep_._M_string_length;
      if (sVar2 == 0) {
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x96,"Slice leveldb::InternalKey::Encode() const");
      }
      local_48.data_ = (pFVar1->largest).rep_._M_dataplus._M_p;
      local_48.size_ = sVar2;
      iVar3 = InternalKeyComparator::Compare(icmp,&local_48,key);
      uVar5 = uVar5 & 0xffffffff;
      if (-1 < iVar3) {
        uVar5 = (ulong)uVar7;
      }
      uVar4 = (uint)uVar5;
      if (-1 >= iVar3) {
        uVar6 = uVar7 + 1;
      }
    } while (uVar6 < uVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

int FindFile(const InternalKeyComparator& icmp,
             const std::vector<FileMetaData*>& files, const Slice& key) {
  uint32_t left = 0;
  uint32_t right = files.size();
  while (left < right) {
    uint32_t mid = (left + right) / 2;
    const FileMetaData* f = files[mid];
    if (icmp.InternalKeyComparator::Compare(f->largest.Encode(), key) < 0) {
      // Key at "mid.largest" is < "target".  Therefore all
      // files at or before "mid" are uninteresting.
      left = mid + 1;
    } else {
      // Key at "mid.largest" is >= "target".  Therefore all files
      // after "mid" are uninteresting.
      right = mid;
    }
  }
  return right;
}